

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O3

void __thiscall MatryoshkaDAG::computeTopK(MatryoshkaDAG *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  undefined8 uVar6;
  long lVar7;
  MatryoshkaParams *pMVar8;
  undefined8 *puVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  value_type nonDomainCandidate;
  heapT heapOPTDomain;
  heapT heapOPTNonDomain;
  value_type domainCandidate;
  value_type local_e8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
  local_b8;
  binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
  local_88;
  value_type local_58;
  long local_38;
  
  pMVar8 = this->params;
  if (1 < pMVar8->n) {
    uVar12 = 2;
    local_c0 = 0;
    do {
      local_88.super_type.super_base_type.super_size_holder<true,_unsigned_long>.size_ =
           (base_type)(size_holder<true,_unsigned_long>)0x0;
      local_88.top_element = (node_pointer)0x0;
      local_88.trees.super_type.data_.root_plus_size_.super_size_traits.size_ = 0;
      local_88.trees.super_type.data_.root_plus_size_.m_header.super_node.next_ =
           &local_88.trees.super_type.data_.root_plus_size_.m_header.super_node;
      local_b8.trees.super_type.data_.root_plus_size_.super_size_traits.size_ = 0;
      local_b8.super_type.super_base_type.super_size_holder<true,_unsigned_long>.size_ =
           (base_type)(size_holder<true,_unsigned_long>)0x0;
      local_b8.top_element = (node_pointer)0x0;
      local_b8.trees.super_type.data_.root_plus_size_.m_header.super_node.next_ =
           &local_b8.trees.super_type.data_.root_plus_size_.m_header.super_node;
      local_b8.trees.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           local_b8.trees.super_type.data_.root_plus_size_.m_header.super_node.next_;
      local_88.trees.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           local_88.trees.super_type.data_.root_plus_size_.m_header.super_node.next_;
      if (1 < uVar12) {
        sVar10 = 1;
        lVar11 = 0;
        do {
          pdVar2 = *(double **)
                    ((long)&(((this->OPTD).
                              super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                            )._M_impl.super__Vector_impl_data + lVar11);
          local_e8.score = *pdVar2;
          local_e8.backOptimalIndex = (size_t)pdVar2[2];
          local_e8.backPointer = sVar10;
          boost::heap::
          binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
          ::push(&local_88,&local_e8);
          pdVar2 = *(double **)
                    ((long)&(((this->OPT).
                              super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                            )._M_impl.super__Vector_impl_data + lVar11);
          local_58.backOptimalIndex = (size_t)pdVar2[2];
          local_58.score = *pdVar2;
          local_58.backPointer = (size_t)pdVar2[1];
          dVar13 = q(this,sVar10,uVar12);
          local_58.score = dVar13 + local_58.score;
          local_58.backPointer = sVar10;
          boost::heap::
          binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
          ::push(&local_b8,&local_58);
          lVar7 = local_c0 + sVar10;
          sVar10 = sVar10 + 1;
          lVar11 = lVar11 + 0x18;
        } while (lVar7 != 1);
        pMVar8 = this->params;
      }
      local_d0 = uVar12;
      if (pMVar8->K != 0) {
        local_38 = uVar12 * 8;
        lVar7 = 0;
        lVar11 = 0;
        uVar12 = 0;
        do {
          if (local_b8.top_element == (node_pointer)0x0) {
LAB_0013e965:
            __assert_fail("!empty()","/usr/include/boost/heap/binomial_heap.hpp",0x152,
                          "const_reference boost::heap::binomial_heap<MatryoshkaDAG::SubProblem>::top() const [T = MatryoshkaDAG::SubProblem, A0 = boost::parameter::void_, A1 = boost::parameter::void_, A2 = boost::parameter::void_, A3 = boost::parameter::void_]"
                         );
          }
          lVar4 = local_38 * 3;
          lVar3 = *(long *)((long)&(((this->OPTD).
                                     super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                                   )._M_impl.super__Vector_impl_data + lVar4);
          *(size_t *)(lVar3 + 0x10 + lVar7) =
               ((local_b8.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value.
               backOptimalIndex;
          dVar13 = (double)((local_b8.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>
                           ).value.backPointer;
          pdVar2 = (double *)(lVar3 + lVar7);
          *pdVar2 = ((local_b8.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value
                    .score;
          pdVar2[1] = dVar13;
          lVar3 = *(long *)((long)&(((this->OPTD).
                                     super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                                   )._M_impl.super__Vector_impl_data + lVar4);
          local_c8 = uVar12;
          boost::heap::
          binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
          ::pop(&local_b8);
          dVar13 = (double)(*(long *)(lVar3 + 0x10 + lVar7) + 1);
          if ((ulong)dVar13 < this->params->K) {
            sVar10 = *(size_t *)(lVar3 + 8 + lVar7);
            lVar3 = *(long *)&(this->OPT).
                              super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar10 - 1].
                              super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                              ._M_impl.super__Vector_impl_data;
            local_e8.backOptimalIndex = *(size_t *)(lVar3 + 0x10 + (long)dVar13 * 0x18);
            pdVar2 = (double *)(lVar3 + (long)dVar13 * 0x18);
            local_e8.score = *pdVar2;
            local_e8.backPointer = (size_t)pdVar2[1];
            dVar14 = q(this,sVar10,local_d0);
            local_e8.score = dVar14 + local_e8.score;
            local_e8.backPointer = sVar10;
            local_e8.backOptimalIndex = (size_t)dVar13;
            boost::heap::
            binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
            ::push(&local_b8,&local_e8);
          }
          if (local_88.top_element == (node_pointer)0x0) goto LAB_0013e965;
          dVar13 = ((local_88.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value.
                   score;
          lVar3 = *(long *)((long)&(((this->OPTD).
                                     super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                                   )._M_impl.super__Vector_impl_data + lVar4);
          lVar4 = *(long *)((long)&(((this->OPT).
                                     super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                                   )._M_impl.super__Vector_impl_data + lVar4);
          pdVar2 = (double *)(lVar3 + lVar11 * 0x18);
          if (dVar13 < *pdVar2 || dVar13 == *pdVar2) {
            puVar1 = (undefined8 *)(lVar3 + lVar11 * 0x18);
            puVar9 = (undefined8 *)(lVar4 + lVar7);
            puVar9[2] = puVar1[2];
            uVar6 = puVar1[1];
            *puVar9 = *puVar1;
            puVar9[1] = uVar6;
            lVar11 = lVar11 + 1;
          }
          else {
            sVar10 = ((local_88.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).
                     value.backPointer;
            sVar5 = ((local_88.top_element)->super_heap_node<MatryoshkaDAG::SubProblem,_true>).value
                    .backOptimalIndex;
            *(double *)(lVar4 + lVar7) = dVar13;
            *(size_t *)(lVar4 + 8 + lVar7) = sVar10;
            *(size_t *)(lVar4 + 0x10 + lVar7) = sVar5;
            boost::heap::
            binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
            ::pop(&local_88);
            dVar13 = (double)(sVar5 + 1);
            if ((ulong)dVar13 < this->params->K) {
              local_e8.score =
                   *(double *)
                    (*(long *)&(this->OPTD).
                               super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[sVar10 - 1].
                               super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                               ._M_impl.super__Vector_impl_data + (long)dVar13 * 0x18);
              local_e8.backPointer = sVar10;
              local_e8.backOptimalIndex = (size_t)dVar13;
              boost::heap::
              binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
              ::push(&local_88,&local_e8);
            }
          }
          uVar12 = local_c8 + 1;
          lVar7 = lVar7 + 0x18;
        } while (uVar12 < this->params->K);
      }
      boost::heap::
      binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
      ::~binomial_heap(&local_b8);
      boost::heap::
      binomial_heap<MatryoshkaDAG::SubProblem,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
      ::~binomial_heap(&local_88);
      uVar12 = local_d0 + 1;
      pMVar8 = this->params;
      local_c0 = local_c0 + -1;
    } while (uVar12 <= pMVar8->n);
  }
  return;
}

Assistant:

void MatryoshkaDAG::computeTopK() {
    //std::cerr << "begin computeTopK()\n";
    for (size_t l=2; l<=params->n; l++) {
        /*
        
        OPT(l) = max{  max_{ k<l } OPTD(k-1),  // OPT(l) ends in a non-domain
                       OPTD(l) }               // OPT(l) ends in a domain
        
        OPTD(l) = max_{ k<l } OPT(k-1) + q(k,l)
        
        */
        using heapT = boost::heap::binomial_heap<SubProblem>;
        heapT heapOPTNonDomain;
        heapT heapOPTDomain;

        for (size_t k=1; k<l; k++) {
            auto nonDomainCandidate = OPTD[k-1][0];
            nonDomainCandidate.backPointer = k;
            heapOPTNonDomain.push(nonDomainCandidate); 

            auto domainCandidate = OPT[k-1][0];
            domainCandidate.score += q(k,l);
            domainCandidate.backPointer = k;
            heapOPTDomain.push(domainCandidate);
        }

        auto pushSubProblem = [&](heapT & heap, SubProblem & subProb, bool isDomain) {
            heap.pop();
            auto nextOptimalIndex = subProb.backOptimalIndex + 1;
            auto k = subProb.backPointer;

            if (nextOptimalIndex < params->K) {
                SubProblem newCandidate;
                if (isDomain) {
                    newCandidate = OPT[k-1][nextOptimalIndex];
                    newCandidate.score += q(k,l);
                } else {
                    newCandidate = OPTD[k-1][nextOptimalIndex];
                }
                newCandidate.backPointer = k;
                newCandidate.backOptimalIndex = nextOptimalIndex;
                heap.push(newCandidate);
            }
        };

        size_t i = 0;
        size_t j = 0;
        while (i < params->K) {
            OPTD[l][i] = heapOPTDomain.top();
            pushSubProblem(heapOPTDomain, OPTD[l][i], true);
            auto nonDomainCandidate = heapOPTNonDomain.top();
             
            if (nonDomainCandidate.score > OPTD[l][j].score) {
                OPT[l][i] = nonDomainCandidate;
                pushSubProblem(heapOPTNonDomain, nonDomainCandidate, false);
            } else {
                OPT[l][i] = OPTD[l][j];
                j++;
            }

            i++;    
        }
    }

    /*std::cerr << "In topK()\n";
    for (size_t i = 0; i < params->K; ++i) {
        std::cerr << "The " << i << "th-best solution had score " << OPT[params->n][i].score << "\n";
    }*/
}